

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

bool __thiscall wallet::WalletBatch::EraseLockedUTXO(WalletBatch *this,COutPoint *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<transaction_identifier<false>,_unsigned_int>_>
  local_70;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = *(undefined8 *)(output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar4 = *(undefined8 *)((output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar5 = *(undefined8 *)((output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar6 = *(undefined8 *)((output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  uVar2 = output->n;
  paVar1 = &local_70.first.field_2;
  local_70.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,DBKeys::LOCKED_UTXO_abi_cxx11_,
             DAT_013fd048 + DBKeys::LOCKED_UTXO_abi_cxx11_);
  local_70.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = uVar3;
  local_70.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = uVar4;
  local_70.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ = uVar5;
  local_70.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = uVar6;
  local_70.second.second = uVar2;
  bVar7 = EraseIC<std::pair<std::__cxx11::string,std::pair<transaction_identifier<false>,unsigned_int>>>
                    (this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.first._M_dataplus._M_p,local_70.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::EraseLockedUTXO(const COutPoint& output)
{
    return EraseIC(std::make_pair(DBKeys::LOCKED_UTXO, std::make_pair(output.hash, output.n)));
}